

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::scatterv_big<TwoBSA<unsigned_int>>
               (TwoBSA<unsigned_int> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               TwoBSA<unsigned_int> *out,size_t recv_size,int root,comm *comm)

{
  undefined4 uVar1;
  int iVar2;
  const_reference pvVar3;
  MPI_Datatype poVar4;
  MPI_Comm poVar5;
  MPI_Request *ppoVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__stat_loc;
  datatype local_e0;
  undefined1 local_c8 [8];
  datatype dt_1;
  datatype local_a0;
  undefined1 local_88 [8];
  datatype dt;
  long lStack_68;
  int i;
  size_t offset;
  undefined1 local_58 [4];
  int tag;
  requests reqs;
  comm *comm_local;
  int root_local;
  size_t recv_size_local;
  TwoBSA<unsigned_int> *out_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes_local;
  TwoBSA<unsigned_int> *msgs_local;
  
  __stat_loc = sizes;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)comm;
  requests::requests((requests *)local_58);
  iVar2 = mxx::comm::rank((comm *)reqs.m_requests.
                                  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == root) {
    lStack_68 = 0;
    for (dt._20_4_ = 0; uVar1 = dt._20_4_,
        iVar2 = mxx::comm::size((comm *)reqs.m_requests.
                                        super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage),
        (int)uVar1 < iVar2; dt._20_4_ = dt._20_4_ + 1) {
      get_datatype<TwoBSA<unsigned_int>>();
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (sizes,(long)(int)dt._20_4_);
      mxx::datatype::contiguous((datatype *)local_88,&local_a0,*pvVar3);
      mxx::datatype::~datatype(&local_a0);
      if (dt._20_4_ == root) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (sizes,(long)(int)dt._20_4_);
        std::copy<TwoBSA<unsigned_int>const*,TwoBSA<unsigned_int>*>
                  (msgs + lStack_68,msgs + lStack_68 + *pvVar3,out);
      }
      else {
        poVar4 = mxx::datatype::type((datatype *)local_88);
        uVar1 = dt._20_4_;
        poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_
                           ((comm *)reqs.m_requests.
                                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ppoVar6 = requests::add((requests *)local_58);
        MPI_Isend(msgs + lStack_68,1,poVar4,uVar1,0x4d2,poVar5,ppoVar6);
      }
      __stat_loc = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(long)(int)dt._20_4_;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (sizes,(size_type)__stat_loc);
      lStack_68 = *pvVar3 + lStack_68;
      mxx::datatype::~datatype((datatype *)local_88);
    }
  }
  else {
    get_datatype<TwoBSA<unsigned_int>>();
    mxx::datatype::contiguous((datatype *)local_c8,&local_e0,recv_size);
    mxx::datatype::~datatype(&local_e0);
    poVar4 = mxx::datatype::type((datatype *)local_c8);
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_
                       ((comm *)reqs.m_requests.
                                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppoVar6 = requests::add((requests *)local_58);
    __stat_loc = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    MPI_Irecv(out,1,poVar4,root,0x4d2,poVar5,ppoVar6);
    mxx::datatype::~datatype((datatype *)local_c8);
  }
  requests::wait((requests *)local_58,__stat_loc);
  requests::~requests((requests *)local_58);
  return;
}

Assistant:

void scatterv_big(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        std::size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(msgs+offset, msgs+offset+sizes[i], out);
            } else {
                MPI_Isend(const_cast<T*>(msgs)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_size);
        MPI_Irecv(const_cast<T*>(out), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}